

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall
chatra::ValueWriterForDebugger::addValue(ValueWriterForDebugger *this,string *key,Value *v)

{
  unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
  *puVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_false,_true>,_bool>
  pVar5;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  uint local_12c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_true>
  _Stack_128;
  uint count;
  undefined1 local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_e8 [8];
  mapped_type vFirst;
  int local_34;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_28;
  iterator it;
  Value *v_local;
  string *key_local;
  ValueWriterForDebugger *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
               )v;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(&this->keys,key);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::cend(&this->keys);
  bVar2 = std::__detail::operator==(&local_28,&local_30);
  if (bVar2) {
    local_34 = 1;
    std::
    unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::emplace<std::__cxx11::string&,int>
              ((unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&this->keys,key,&local_34);
    std::
    unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
    ::emplace<std::__cxx11::string,chatra::debugger::Value>
              ((unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
                *)this->values,key,v);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                           *)&local_28);
    if (ppVar3->second == 1) {
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>_>_>
               ::operator[](this->values,key);
      debugger::Value::Value((Value *)local_e8,pmVar4);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>_>_>
      ::erase(this->values,key);
      puVar1 = (unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
                *)this->values;
      std::operator+(&local_118,key,"[1]");
      pVar5 = std::
              unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
              ::emplace<std::__cxx11::string,chatra::debugger::Value>
                        (puVar1,&local_118,(Value *)local_e8);
      _Stack_128._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_true>
           ._M_cur;
      local_120 = pVar5.second;
      std::__cxx11::string::~string((string *)&local_118);
      debugger::Value::~Value((Value *)local_e8);
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                           *)&local_28);
    local_12c = ppVar3->second + 1;
    puVar1 = (unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
              *)this->values;
    std::operator+(&local_190,key,"[");
    std::__cxx11::to_string(&local_1b0,local_12c);
    std::operator+(&local_170,&local_190,&local_1b0);
    std::operator+(&local_150,&local_170,"]");
    std::
    unordered_map<std::__cxx11::string,chatra::debugger::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>>
    ::emplace<std::__cxx11::string,chatra::debugger::Value>(puVar1,&local_150,v);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::
    unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::emplace<std::__cxx11::string,unsigned_int&>
              ((unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&this->keys,key,&local_12c);
  }
  return;
}

Assistant:

void addValue(std::string key, debugger::Value v) {
		auto it = keys.find(key);
		if (it == keys.cend()) {
			keys.emplace(key, 1);
			values.emplace(std::move(key), std::move(v));
			return;
		}

		if (it->second == 1) {
			auto vFirst = values[key];
			values.erase(key);
			values.emplace(key + "[1]", std::move(vFirst));
		}

		auto count = it->second + 1;
		values.emplace(key + "[" + std::to_string(count) + "]", std::move(v));
		keys.emplace(std::move(key), count);
	}